

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ecdsa_signature_serialize_der
              (secp256k1_context *ctx,uchar *output,size_t *outputlen,secp256k1_ecdsa_signature *sig
              )

{
  ulong uVar1;
  char *__src;
  char *__src_00;
  ulong uVar2;
  size_t __n;
  size_t __n_00;
  uchar s_1 [33];
  uchar r_1 [33];
  secp256k1_scalar s;
  secp256k1_scalar r;
  char local_d8 [48];
  char local_a8 [48];
  secp256k1_scalar local_78;
  secp256k1_scalar local_58;
  
  __src_00 = local_d8;
  if (output == (uchar *)0x0) {
    secp256k1_ecdsa_signature_serialize_der_cold_3();
  }
  else if (outputlen == (size_t *)0x0) {
    secp256k1_ecdsa_signature_serialize_der_cold_2();
  }
  else {
    if (sig != (secp256k1_ecdsa_signature *)0x0) {
      local_58.d[0] = *(uint64_t *)sig->data;
      local_58.d[1] = *(uint64_t *)(sig->data + 8);
      local_58.d[2] = *(uint64_t *)(sig->data + 0x10);
      local_58.d[3] = *(uint64_t *)(sig->data + 0x18);
      local_78.d[0] = *(uint64_t *)(sig->data + 0x20);
      local_78.d[1] = *(uint64_t *)(sig->data + 0x28);
      local_78.d[2] = *(uint64_t *)(sig->data + 0x30);
      local_78.d[3] = *(uint64_t *)(sig->data + 0x38);
      local_a8[0x20] = 0;
      local_a8[0x10] = '\0';
      local_a8[0x11] = '\0';
      local_a8[0x12] = '\0';
      local_a8[0x13] = '\0';
      local_a8[0x14] = '\0';
      local_a8[0x15] = '\0';
      local_a8[0x16] = '\0';
      local_a8[0x17] = '\0';
      local_a8[0x18] = '\0';
      local_a8[0x19] = '\0';
      local_a8[0x1a] = '\0';
      local_a8[0x1b] = '\0';
      local_a8[0x1c] = '\0';
      local_a8[0x1d] = '\0';
      local_a8[0x1e] = '\0';
      local_a8[0x1f] = '\0';
      local_a8[0] = '\0';
      local_a8[1] = '\0';
      local_a8[2] = '\0';
      local_a8[3] = '\0';
      local_a8[4] = '\0';
      local_a8[5] = '\0';
      local_a8[6] = '\0';
      local_a8[7] = '\0';
      local_a8[8] = '\0';
      local_a8[9] = '\0';
      local_a8[10] = '\0';
      local_a8[0xb] = '\0';
      local_a8[0xc] = '\0';
      local_a8[0xd] = '\0';
      local_a8[0xe] = '\0';
      local_a8[0xf] = '\0';
      local_d8[0x20] = 0;
      local_d8[0x10] = '\0';
      local_d8[0x11] = '\0';
      local_d8[0x12] = '\0';
      local_d8[0x13] = '\0';
      local_d8[0x14] = '\0';
      local_d8[0x15] = '\0';
      local_d8[0x16] = '\0';
      local_d8[0x17] = '\0';
      local_d8[0x18] = '\0';
      local_d8[0x19] = '\0';
      local_d8[0x1a] = '\0';
      local_d8[0x1b] = '\0';
      local_d8[0x1c] = '\0';
      local_d8[0x1d] = '\0';
      local_d8[0x1e] = '\0';
      local_d8[0x1f] = '\0';
      local_d8[0] = '\0';
      local_d8[1] = '\0';
      local_d8[2] = '\0';
      local_d8[3] = '\0';
      local_d8[4] = '\0';
      local_d8[5] = '\0';
      local_d8[6] = '\0';
      local_d8[7] = '\0';
      local_d8[8] = '\0';
      local_d8[9] = '\0';
      local_d8[10] = '\0';
      local_d8[0xb] = '\0';
      local_d8[0xc] = '\0';
      local_d8[0xd] = '\0';
      local_d8[0xe] = '\0';
      local_d8[0xf] = '\0';
      secp256k1_scalar_get_b32((uchar *)(local_a8 + 1),&local_58);
      secp256k1_scalar_get_b32((uchar *)(local_d8 + 1),&local_78);
      __n = 0x21;
      __src = local_a8;
      do {
        if ((*__src != '\0') || (__src[1] < '\0')) goto LAB_00113fc1;
        __n = __n - 1;
        __src = __src + 1;
      } while (__n != 1);
      __n = 1;
      __src = local_a8 + 0x20;
LAB_00113fc1:
      __n_00 = 0x21;
      do {
        if ((*__src_00 != '\0') || (__src_00[1] < '\0')) goto LAB_00113ff1;
        __n_00 = __n_00 - 1;
        __src_00 = __src_00 + 1;
      } while (__n_00 != 1);
      __n_00 = 1;
      __src_00 = local_d8 + 0x20;
LAB_00113ff1:
      uVar2 = __n + __n_00 + 6;
      uVar1 = *outputlen;
      *outputlen = uVar2;
      if (uVar1 < uVar2) {
        return 0;
      }
      *output = '0';
      output[1] = (uchar)__n + (uchar)__n_00 + '\x04';
      output[2] = '\x02';
      output[3] = (uchar)__n;
      memcpy(output + 4,__src,__n);
      output[__n + 4] = '\x02';
      output[__n + 5] = (uchar)__n_00;
      memcpy(output + __n + 6,__src_00,__n_00);
      return 1;
    }
    secp256k1_ecdsa_signature_serialize_der_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_signature_serialize_der(const secp256k1_context* ctx, unsigned char *output, size_t *outputlen, const secp256k1_ecdsa_signature* sig) {
    secp256k1_scalar r, s;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(outputlen != NULL);
    ARG_CHECK(sig != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    return secp256k1_ecdsa_sig_serialize(output, outputlen, &r, &s);
}